

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O1

void Abc_NodeSplitLarge(Abc_Obj_t *pNode)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  char *pcVar3;
  long lVar4;
  
  iVar1 = (pNode->vFanins).nSize;
  uVar2 = Abc_SopGetCubeNum((char *)(pNode->field_5).pData);
  pObj = Abc_NtkDupObj(pNode->pNtk,pNode,0);
  pObj_00 = Abc_NtkDupObj(pNode->pNtk,pNode,0);
  if (0 < (pNode->vFanins).nSize) {
    lVar4 = 0;
    do {
      Abc_ObjAddFanin(pObj,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar4]]);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (pNode->vFanins).nSize);
  }
  if (0 < (pNode->vFanins).nSize) {
    lVar4 = 0;
    do {
      Abc_ObjAddFanin(pObj_00,(Abc_Obj_t *)
                              pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar4]]);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (pNode->vFanins).nSize);
  }
  Abc_ObjRemoveFanins(pNode);
  Abc_ObjAddFanin(pNode,pObj);
  Abc_ObjAddFanin(pNode,pObj_00);
  pcVar3 = Abc_SopCreateOr((Mem_Flex_t *)pNode->pNtk->pManFunc,2,(int *)0x0);
  (pNode->field_5).pData = pcVar3;
  if (1 < (int)uVar2) {
    lVar4 = (ulong)(uVar2 >> 1) * ((long)iVar1 + 3);
    *(undefined1 *)((long)(pObj->field_5).pData + lVar4) = 0;
    (pObj_00->field_5).pData = (void *)((long)(pObj_00->field_5).pData + lVar4);
    return;
  }
  __assert_fail("nCubes > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanOrder.c"
                ,0x106,"void Abc_NodeSplitLarge(Abc_Obj_t *)");
}

Assistant:

void Abc_NodeSplitLarge( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNode1, * pNode2, * pFanin;
    int CutPoint, nVars = Abc_ObjFaninNum(pNode);
    int i, nCubes = Abc_SopGetCubeNum((char *)pNode->pData);
    pNode1 = Abc_NtkDupObj( pNode->pNtk, pNode, 0 );
    pNode2 = Abc_NtkDupObj( pNode->pNtk, pNode, 0 );
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Abc_ObjAddFanin( pNode1, pFanin );
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Abc_ObjAddFanin( pNode2, pFanin );    
    // update the node
    Abc_ObjRemoveFanins( pNode );
    Abc_ObjAddFanin( pNode, pNode1 );
    Abc_ObjAddFanin( pNode, pNode2 );
    pNode->pData = Abc_SopCreateOr( (Mem_Flex_t *)pNode->pNtk->pManFunc, 2, NULL );
    // update covers of the nodes
    assert( nCubes > 1 );
    CutPoint = (nCubes / 2) * (nVars + 3);
    ((char *)pNode1->pData)[CutPoint] = 0;
    pNode2->pData = (char *)pNode2->pData + CutPoint;
}